

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

DiskType checkBluRayMux(char *metaFileName,int *autoChapterLen,
                       vector<double,_std::allocator<double>_> *customChaptersList,
                       int *firstMplsOffset,int *firstM2tsOffset,bool *insertBlankPL,int *blankNum,
                       bool *stereoMode,string *isoDiskLabel)

{
  pointer pbVar1;
  bool bVar2;
  int32_t iVar3;
  long lVar4;
  ostream *poVar5;
  undefined4 *puVar6;
  string *chap;
  _Alloc_hider chapterStr;
  DiskType DVar7;
  pointer value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paramPair;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  uint *local_248;
  undefined8 local_240;
  uint local_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  uint *local_228;
  undefined8 local_220;
  uint local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  uint *local_208;
  undefined8 local_200;
  uint local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  double local_1e8;
  TextFile file;
  ostringstream ss;
  string *local_1a0;
  
  *autoChapterLen = 0;
  DVar7 = NONE;
  *stereoMode = false;
  TextFile::TextFile(&file,metaFileName,1,0);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  TextFile::readLine(&file,&str);
  do {
    if (str._M_string_length == 0) {
      std::__cxx11::string::~string((string *)&str);
      File::~File(&file.super_File);
      return DVar7;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"MUXOPT",(allocator<char> *)&params);
    bVar2 = strStartWith(&str,(string *)&ss);
    std::__cxx11::string::~string((string *)&ss);
    if (bVar2) {
      splitQuotedStr_abi_cxx11_(&params,str._M_dataplus._M_p,' ');
      pbVar1 = params.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (value = params.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; value != pbVar1; value = value + 1) {
        trimStr((string *)&ss,value);
        splitStr_abi_cxx11_(&paramPair,_ss,'=');
        std::__cxx11::string::~string((string *)&ss);
        if (paramPair.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            paramPair.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar2 = std::operator==(paramPair.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,"--auto-chapters");
          if (bVar2) {
            iVar3 = strToInt32(paramPair.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
            *autoChapterLen = iVar3 * 0x3c;
          }
          else {
            bVar2 = std::operator==(paramPair.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,"--custom-chapters");
            if ((bVar2) &&
               (0x20 < (ulong)((long)paramPair.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)paramPair.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start))) {
              splitStr_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&ss,paramPair.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus.
                                         _M_p,';');
              for (chapterStr._M_p = _ss; (string *)chapterStr._M_p != local_1a0;
                  chapterStr._M_p = chapterStr._M_p + 0x20) {
                local_1e8 = timeToFloat((string *)chapterStr._M_p);
                std::vector<double,_std::allocator<double>_>::emplace_back<double>
                          (customChaptersList,&local_1e8);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&ss);
            }
            else {
              bVar2 = std::operator==(paramPair.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,"--mplsOffset");
              if (bVar2) {
                iVar3 = strToInt32(paramPair.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
                *firstMplsOffset = iVar3;
                if (1999 < iVar3) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
                  poVar5 = std::operator<<((ostream *)&ss,"Too large m2ts offset ");
                  std::ostream::operator<<(poVar5,*firstMplsOffset);
                  puVar6 = (undefined4 *)__cxa_allocate_exception(0x28);
                  std::__cxx11::stringbuf::str();
                  *puVar6 = 3;
                  *(undefined4 **)(puVar6 + 2) = puVar6 + 6;
                  if (local_208 == &local_1f8) {
                    puVar6[6] = local_1f8;
                    puVar6[7] = uStack_1f4;
                    puVar6[8] = uStack_1f0;
                    puVar6[9] = uStack_1ec;
                  }
                  else {
                    *(uint **)(puVar6 + 2) = local_208;
                    *(ulong *)(puVar6 + 6) = CONCAT44(uStack_1f4,local_1f8);
                  }
                  *(undefined8 *)(puVar6 + 4) = local_200;
                  local_200 = 0;
                  local_1f8 = local_1f8 & 0xffffff00;
                  local_208 = &local_1f8;
                  __cxa_throw(puVar6,&VodCoreException::typeinfo,VodCoreException::~VodCoreException
                             );
                }
              }
              else {
                bVar2 = std::operator==(paramPair.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,"--blankOffset");
                if (bVar2) {
                  iVar3 = strToInt32(paramPair.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
                  *blankNum = iVar3;
                  if (1999 < iVar3) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
                    poVar5 = std::operator<<((ostream *)&ss,"Too large black playlist offset ");
                    std::ostream::operator<<(poVar5,*blankNum);
                    puVar6 = (undefined4 *)__cxa_allocate_exception(0x28);
                    std::__cxx11::stringbuf::str();
                    *puVar6 = 3;
                    *(undefined4 **)(puVar6 + 2) = puVar6 + 6;
                    if (local_228 == &local_218) {
                      puVar6[6] = local_218;
                      puVar6[7] = uStack_214;
                      puVar6[8] = uStack_210;
                      puVar6[9] = uStack_20c;
                    }
                    else {
                      *(uint **)(puVar6 + 2) = local_228;
                      *(ulong *)(puVar6 + 6) = CONCAT44(uStack_214,local_218);
                    }
                    *(undefined8 *)(puVar6 + 4) = local_220;
                    local_220 = 0;
                    local_218 = local_218 & 0xffffff00;
                    local_228 = &local_218;
                    __cxa_throw(puVar6,&VodCoreException::typeinfo,
                                VodCoreException::~VodCoreException);
                  }
                }
                else {
                  bVar2 = std::operator==(paramPair.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,"--m2tsOffset");
                  if (bVar2) {
                    iVar3 = strToInt32(paramPair.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p
                                      );
                    *firstM2tsOffset = iVar3;
                    if (99999 < iVar3) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
                      poVar5 = std::operator<<((ostream *)&ss,"Too large m2ts offset ");
                      std::ostream::operator<<(poVar5,*firstM2tsOffset);
                      puVar6 = (undefined4 *)__cxa_allocate_exception(0x28);
                      std::__cxx11::stringbuf::str();
                      *puVar6 = 3;
                      *(undefined4 **)(puVar6 + 2) = puVar6 + 6;
                      if (local_248 == &local_238) {
                        puVar6[6] = local_238;
                        puVar6[7] = uStack_234;
                        puVar6[8] = uStack_230;
                        puVar6[9] = uStack_22c;
                      }
                      else {
                        *(uint **)(puVar6 + 2) = local_248;
                        *(ulong *)(puVar6 + 6) = CONCAT44(uStack_234,local_238);
                      }
                      *(undefined8 *)(puVar6 + 4) = local_240;
                      local_238 = local_238 & 0xffffff00;
                      __cxa_throw(puVar6,&VodCoreException::typeinfo,
                                  VodCoreException::~VodCoreException);
                    }
                  }
                  else {
                    bVar2 = std::operator==(paramPair.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            "--insertBlankPL");
                    if (bVar2) {
                      *insertBlankPL = true;
                    }
                    else {
                      bVar2 = std::operator==(paramPair.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start,"--label");
                      if (bVar2) {
                        std::__cxx11::string::_M_assign((string *)isoDiskLabel);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&paramPair);
      }
      lVar4 = std::__cxx11::string::find((char *)&str,0x205b31);
      if (lVar4 != -1) {
        V3_flags._0_1_ = (byte)V3_flags | 1;
      }
      lVar4 = std::__cxx11::string::find((char *)&str,0x205b3e);
      DVar7 = BLURAY;
      if (lVar4 == -1) {
        lVar4 = std::__cxx11::string::find((char *)&str,0x205b48);
        DVar7 = (uint)(lVar4 != -1) * 2;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&params);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ss,"V_MPEG4/ISO/MVC",(allocator<char> *)&params);
      bVar2 = strStartWith(&str,(string *)&ss);
      std::__cxx11::string::~string((string *)&ss);
      if (bVar2) {
        *stereoMode = true;
      }
    }
    TextFile::readLine(&file,&str);
  } while( true );
}

Assistant:

DiskType checkBluRayMux(const char* metaFileName, int& autoChapterLen, vector<double>& customChaptersList,
                        int& firstMplsOffset, int& firstM2tsOffset, bool& insertBlankPL, int& blankNum,
                        bool& stereoMode, std::string& isoDiskLabel)
{
    autoChapterLen = 0;
    stereoMode = false;
    TextFile file(metaFileName, File::ofRead);
    string str;
    file.readLine(str);
    DiskType result = DiskType::NONE;
    while (str.length() > 0)
    {
        if (strStartWith(str, "MUXOPT"))
        {
            vector<string> params = splitQuotedStr(str.c_str(), ' ');
            for (const auto& param : params)
            {
                vector<string> paramPair = splitStr(trimStr(param).c_str(), '=');
                if (paramPair.empty())
                    continue;
                if (paramPair[0] == "--auto-chapters")
                    autoChapterLen = strToInt32(paramPair[1].c_str()) * 60;
                else if (paramPair[0] == "--custom-chapters" && paramPair.size() > 1)
                {
                    vector<string> chapList = splitStr(paramPair[1].c_str(), ';');
                    for (const string& chap : chapList) customChaptersList.push_back(timeToFloat(chap));
                }
                else if (paramPair[0] == "--mplsOffset")
                {
                    firstMplsOffset = strToInt32(paramPair[1].c_str());
                    if (firstMplsOffset > 1999)
                        THROW(ERR_COMMON, "Too large m2ts offset " << firstMplsOffset)
                }
                else if (paramPair[0] == "--blankOffset")
                {
                    blankNum = strToInt32(paramPair[1].c_str());
                    if (blankNum > 1999)
                        THROW(ERR_COMMON, "Too large black playlist offset " << blankNum)
                }
                else if (paramPair[0] == "--m2tsOffset")
                {
                    firstM2tsOffset = strToInt32(paramPair[1].c_str());
                    if (firstM2tsOffset > 99999)
                        THROW(ERR_COMMON, "Too large m2ts offset " << firstM2tsOffset)
                }
                else if (paramPair[0] == "--insertBlankPL")
                    insertBlankPL = true;
                else if (paramPair[0] == "--label")
                {
                    isoDiskLabel = paramPair[1];
                }
            }

            if (str.find("--blu-ray-v3") != string::npos)
                V3_flags |= HDMV_V3;

            if (str.find("--blu-ray") != string::npos)
                result = DiskType::BLURAY;
            else if (str.find("--avchd") != string::npos)
                result = DiskType::AVCHD;
            else
                result = DiskType::NONE;
        }
        else if (strStartWith(str, "V_MPEG4/ISO/MVC"))
            stereoMode = true;

        file.readLine(str);
    }
    return result;
}